

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O2

void __thiscall
Js::DynamicProfileInfo::RecordPolymorphicCallSiteInfo
          (DynamicProfileInfo *this,FunctionBody *functionBody,ProfileId callSiteId,
          FunctionInfo *calleeFunctionInfo)

{
  FunctionProxy *this_00;
  SourceId curSourceId;
  LocalFunctionId curFunctionId;
  ScriptContext *pSVar1;
  ScriptContext *pSVar2;
  DWORD_PTR DVar3;
  DWORD_PTR DVar4;
  LocalFunctionId LStack_40;
  
  if ((calleeFunctionInfo == (FunctionInfo *)0x0) ||
     (this_00 = (calleeFunctionInfo->functionBodyImpl).ptr, this_00 == (FunctionProxy *)0x0)) {
    LStack_40 = 0xffffffff;
  }
  else {
    pSVar1 = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
    pSVar2 = FunctionProxy::GetScriptContext(this_00);
    if (pSVar1 == pSVar2) {
      DVar3 = FunctionProxy::GetSecondaryHostSourceContext((FunctionProxy *)functionBody);
      DVar4 = FunctionProxy::GetSecondaryHostSourceContext(this_00);
      if (DVar3 == DVar4) {
        DVar3 = FunctionProxy::GetHostSourceContext(this_00);
        DVar4 = FunctionProxy::GetHostSourceContext((FunctionProxy *)functionBody);
        curSourceId = 0xfffffffd;
        if (DVar4 != (DVar3 & 0xffffffff)) {
          curSourceId = (SourceId)DVar3;
        }
        curFunctionId = FunctionProxy::GetLocalFunctionId(this_00);
        SetFunctionIdSlotForNewPolymorphicCall
                  (this,callSiteId,curFunctionId,curSourceId,functionBody);
        return;
      }
    }
    LStack_40 = 0xfffffffe;
  }
  ResetPolymorphicCallSiteInfo(this,callSiteId,LStack_40);
  return;
}

Assistant:

void DynamicProfileInfo::RecordPolymorphicCallSiteInfo(FunctionBody* functionBody, ProfileId callSiteId, FunctionInfo * calleeFunctionInfo)
    {
        Js::LocalFunctionId functionId;
        if (calleeFunctionInfo == nullptr || !calleeFunctionInfo->HasBody())
        {
            return ResetPolymorphicCallSiteInfo(callSiteId, CallSiteMixed);
        }

        // We can only inline function that are from the same script context. So only record that data
        // We're about to call this function so deserialize it right now.
        FunctionProxy* calleeFunctionProxy = calleeFunctionInfo->GetFunctionProxy();

        if (functionBody->GetScriptContext() == calleeFunctionProxy->GetScriptContext())
        {
            if (functionBody->GetSecondaryHostSourceContext() == calleeFunctionProxy->GetSecondaryHostSourceContext())
            {
                Js::SourceId sourceId = (Js::SourceId)calleeFunctionProxy->GetHostSourceContext();
                if (functionBody->GetHostSourceContext() == sourceId)  // if caller and callee in same file
                {
                    sourceId = CurrentSourceId;
                }
                functionId = calleeFunctionProxy->GetLocalFunctionId();
                SetFunctionIdSlotForNewPolymorphicCall(callSiteId, functionId, sourceId, functionBody);
                return;
            }
        }

        // Pretend that we are cross context when call is crossing script file.
        ResetPolymorphicCallSiteInfo(callSiteId, CallSiteCrossContext);
    }